

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size,HuffmanCode *table,uint32_t *opt_table_size,
               BrotliDecoderStateInternal *s)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  size_t sVar6;
  byte *pbVar7;
  uint last;
  int iVar8;
  uint32_t uVar9;
  long lVar10;
  uint uVar11;
  BrotliRunningHuffmanState BVar12;
  BrotliBitReader *br;
  uint uVar13;
  uint uVar14;
  int iVar15;
  BrotliRunningHuffmanState BVar16;
  uint32_t uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t uVar22;
  uint uVar23;
  uint last_1;
  uint uVar24;
  uint16_t *puVar25;
  uint32_t uVar26;
  sbyte sVar27;
  uint32_t uVar28;
  uint32_t local_4c;
  
  if (BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS < s->substate_huffman) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  uVar19 = alphabet_size & 0x3ff;
  switch(s->substate_huffman) {
  case BROTLI_STATE_HUFFMAN_NONE:
    for (uVar26 = (s->br).bit_pos_ + 2; uVar26 - 0x41 < 2; uVar26 = uVar26 - 8) {
      sVar6 = (s->br).avail_in;
      if (sVar6 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar21 = (s->br).val_;
      pbVar7 = (s->br).next_in;
      (s->br).val_ = uVar21 >> 8;
      (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
      (s->br).bit_pos_ = uVar26 - 10;
      (s->br).avail_in = sVar6 - 1;
      (s->br).next_in = pbVar7 + 1;
    }
    uVar17 = (uint)((s->br).val_ >> ((char)uVar26 - 2U & 0x3f)) & 3;
    s->sub_loop_counter = uVar17;
    (s->br).bit_pos_ = uVar26;
    if (uVar17 != 1) {
      s->repeat = 0;
      s->space = 0x20;
      s->code_length_code_lengths[0] = '\0';
      s->code_length_code_lengths[1] = '\0';
      s->code_length_code_lengths[2] = '\0';
      s->code_length_code_lengths[3] = '\0';
      s->code_length_code_lengths[4] = '\0';
      s->code_length_code_lengths[5] = '\0';
      s->code_length_code_lengths[6] = '\0';
      s->code_length_code_lengths[7] = '\0';
      s->code_length_code_lengths[8] = '\0';
      s->code_length_code_lengths[9] = '\0';
      s->code_length_code_lengths[10] = '\0';
      s->code_length_code_lengths[0xb] = '\0';
      s->code_length_code_lengths[0xc] = '\0';
      s->code_length_code_lengths[0xd] = '\0';
      s->code_length_code_lengths[0xe] = '\0';
      s->code_length_code_lengths[0xf] = '\0';
      *(undefined8 *)(s->code_length_code_lengths + 0xe) = 0;
      s->code_length_histo[2] = 0;
      s->code_length_histo[3] = 0;
      s->code_length_histo[4] = 0;
      s->code_length_histo[5] = 0;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      uVar26 = 0;
      uVar28 = 0x20;
      goto LAB_00102dcd;
    }
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
    uVar26 = (s->br).bit_pos_;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    goto switchD_00102ab4_caseD_2;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    uVar11 = s->symbol;
    goto LAB_00102b48;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    uVar17 = s->sub_loop_counter;
    uVar26 = s->repeat;
    uVar28 = s->space;
LAB_00102dcd:
    local_4c = 8;
    puVar25 = s->code_length_histo;
    for (uVar21 = (ulong)uVar17; uVar21 < 0x12; uVar21 = uVar21 + 1) {
      bVar3 = "\x01\x02\x03\x04"[uVar21];
      uVar17 = (s->br).bit_pos_;
      while (uVar17 - 0x3d < 4) {
        sVar6 = (s->br).avail_in;
        if (sVar6 == 0) {
          if (uVar17 - 0x40 == 0) {
            uVar20 = 0;
          }
          else {
            uVar20 = br->val_ >> ((byte)uVar17 & 0x3f);
          }
          bVar1 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar20];
          if ((uint)bVar1 <= -(uVar17 - 0x40)) goto LAB_00102e97;
          s->sub_loop_counter = (uint32_t)uVar21;
          s->repeat = uVar26;
          s->space = uVar28;
          BVar12 = BROTLI_STATE_HUFFMAN_COMPLEX;
          BVar16 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
          goto LAB_0010341a;
        }
        uVar20 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar20 >> 8;
        (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar20 >> 8;
        uVar17 = uVar17 - 8;
        (s->br).bit_pos_ = uVar17;
        (s->br).avail_in = sVar6 - 1;
        (s->br).next_in = pbVar7 + 1;
      }
      uVar20 = (ulong)((uint)(br->val_ >> ((byte)uVar17 & 0x3f)) & 0xf);
      bVar1 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar20];
LAB_00102e97:
      bVar2 = ""[uVar20];
      (s->br).bit_pos_ = bVar1 + uVar17;
      s->code_length_code_lengths[bVar3] = bVar2;
      if ((0x1111UL >> (uVar20 & 0x3f) & 1) == 0) {
        puVar25[bVar2] = puVar25[bVar2] + 1;
        uVar28 = uVar28 - (0x20U >> (bVar2 & 0x1f));
        uVar26 = uVar26 + 1;
        if (uVar28 - 0x21 < 0xffffffe0) break;
      }
    }
    if ((uVar26 != 1) && (uVar28 != 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    }
    BrotliBuildCodeLengthsHuffmanTable(s->table,s->code_length_code_lengths,puVar25);
    s->code_length_histo[8] = 0;
    s->code_length_histo[9] = 0;
    s->code_length_histo[10] = 0;
    s->code_length_histo[0xb] = 0;
    s->code_length_histo[0xc] = 0;
    s->code_length_histo[0xd] = 0;
    s->code_length_histo[0xe] = 0;
    s->code_length_histo[0xf] = 0;
    puVar25[0] = 0;
    puVar25[1] = 0;
    puVar25[2] = 0;
    puVar25[3] = 0;
    s->code_length_histo[4] = 0;
    s->code_length_histo[5] = 0;
    s->code_length_histo[6] = 0;
    s->code_length_histo[7] = 0;
    puVar25 = s->symbol_lists;
    uVar11 = 0;
    for (lVar10 = -0x20; lVar10 != 0; lVar10 = lVar10 + 2) {
      *(uint *)((long)s->next_symbol + lVar10 * 2 + 0x40) = uVar11 | 0xfffffff0;
      *(undefined2 *)((long)puVar25 + lVar10) = 0xffff;
      uVar11 = uVar11 + 1;
    }
    s->symbol = 0;
    s->repeat = 0;
    s->repeat_code_len = 0;
    s->prev_code_len = 8;
    s->space = 0x8000;
    s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    uVar26 = 0x8000;
    uVar28 = 0;
    uVar17 = 0;
    uVar11 = 0;
    goto LAB_00102f6a;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar11 = s->symbol;
    uVar17 = s->repeat;
    uVar26 = s->space;
    uVar28 = s->repeat_code_len;
    local_4c = s->prev_code_len;
    puVar25 = s->symbol_lists;
LAB_00102f6a:
    iVar8 = BrotliWarmupBitReader(br);
    if (iVar8 != 0) {
LAB_00102f8d:
      uVar21 = (ulong)uVar28;
LAB_00102f93:
      do {
        uVar28 = (uint32_t)uVar21;
        do {
          uVar13 = uVar11;
          if ((uVar19 <= uVar13) || (uVar26 == 0)) {
            s->space = uVar26;
            goto LAB_00103146;
          }
          uVar21 = (s->br).avail_in;
          if (uVar21 < 4) {
            s->symbol = uVar13;
            s->repeat = uVar17;
            s->prev_code_len = local_4c;
            s->repeat_code_len = uVar28;
            s->space = uVar26;
            goto LAB_00103177;
          }
          uVar11 = (s->br).bit_pos_;
          uVar20 = (s->br).val_;
          if (0x1f < uVar11) {
            uVar11 = uVar11 ^ 0x20;
            (s->br).bit_pos_ = uVar11;
            puVar5 = (uint *)(s->br).next_in;
            uVar20 = uVar20 >> 0x20 | (ulong)*puVar5 << 0x20;
            (s->br).val_ = uVar20;
            (s->br).avail_in = uVar21 - 4;
            (s->br).next_in = (uint8_t *)(puVar5 + 1);
          }
          uVar14 = (uint)(uVar20 >> ((byte)uVar11 & 0x3f)) & 0x1f;
          uVar9 = s->table[uVar14].bits + uVar11;
          (s->br).bit_pos_ = uVar9;
          uVar4 = s->table[uVar14].value;
          uVar11 = (uint)uVar4;
          if (uVar4 < 0x10) {
            if (uVar4 != 0) {
              puVar25[s->next_symbol[uVar11]] = (uint16_t)uVar13;
              s->next_symbol[uVar11] = uVar13;
              uVar26 = uVar26 - (0x8000U >> ((byte)uVar4 & 0x1f));
              s->code_length_histo[uVar11] = s->code_length_histo[uVar11] + 1;
              local_4c = uVar11;
            }
            uVar11 = uVar13 + 1;
            uVar17 = 0;
            goto LAB_00102f8d;
          }
          uVar22 = 0;
          uVar21 = 0;
          if (uVar11 == 0x10) {
            uVar21 = (ulong)local_4c;
          }
          uVar11 = uVar11 == 0x10 ^ 3;
          uVar14 = (uint)(uVar20 >> ((byte)uVar9 & 0x3f)) & kBitMask[uVar11];
          (s->br).bit_pos_ = uVar9 + uVar11;
          if (uVar28 == (uint)uVar21) {
            if (uVar17 == 0) {
              uVar21 = (ulong)uVar28;
              goto LAB_00103053;
            }
            iVar8 = uVar17 - 2 << (sbyte)uVar11;
            uVar21 = (ulong)uVar28;
            uVar22 = uVar17;
          }
          else {
LAB_00103053:
            iVar8 = 0;
          }
          uVar17 = uVar14 + iVar8 + 3;
          iVar15 = uVar17 - uVar22;
          uVar11 = iVar15 + uVar13;
          if (uVar19 < uVar11) {
            uVar26 = 0xfffff;
            uVar11 = uVar19;
            goto LAB_00102f93;
          }
          uVar28 = 0;
        } while ((int)uVar21 == 0);
        iVar8 = ((iVar8 + uVar14) - uVar22) + 3;
        uVar14 = s->next_symbol[uVar21];
        do {
          uVar23 = uVar13;
          puVar25[(int)uVar14] = (uint16_t)uVar23;
          iVar8 = iVar8 + -1;
          uVar14 = uVar23;
          uVar13 = uVar23 + 1;
        } while (iVar8 != 0);
        s->next_symbol[uVar21] = uVar23;
        uVar26 = uVar26 - (iVar15 << (0xfU - (char)uVar21 & 0x1f));
        s->code_length_histo[uVar21] = s->code_length_histo[uVar21] + (short)iVar15;
      } while( true );
    }
    uVar13 = s->symbol;
LAB_00103177:
    uVar26 = s->space;
    while (sVar27 = 3, uVar13 < uVar19) {
      if (uVar26 == 0) goto LAB_001033d8;
      uVar17 = (s->br).bit_pos_;
      uVar11 = 0;
      if (uVar17 != 0x40) {
        uVar11 = (uint)(br->val_ >> ((byte)uVar17 & 0x3f));
      }
      bVar3 = s->table[uVar11 & 0x1f].bits;
      if (0x40 - uVar17 < (uint)bVar3) {
LAB_001031f6:
        sVar6 = (s->br).avail_in;
        if (sVar6 == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar21 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar21 >> 8;
        (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
        (s->br).bit_pos_ = uVar17 - 8;
        (s->br).avail_in = sVar6 - 1;
        (s->br).next_in = pbVar7 + 1;
      }
      else {
        uVar4 = s->table[uVar11 & 0x1f].value;
        uVar21 = (ulong)uVar4;
        if (uVar4 < 0x10) {
          (s->br).bit_pos_ = uVar17 + bVar3;
          s->repeat = 0;
          if (uVar21 != 0) {
            s->symbol_lists[s->next_symbol[uVar21]] = (uint16_t)uVar13;
            s->next_symbol[uVar21] = uVar13;
            s->prev_code_len = (uint)uVar4;
            uVar26 = uVar26 - (0x8000U >> ((byte)uVar4 & 0x1f));
            s->space = uVar26;
            s->code_length_histo[uVar21] = s->code_length_histo[uVar21] + 1;
          }
          s->symbol = uVar13 + 1;
          uVar13 = uVar13 + 1;
        }
        else {
          uVar14 = ((uint)uVar4 + (uint)bVar3) - 0xe;
          if (0x40 - uVar17 < uVar14) goto LAB_001031f6;
          uVar23 = uVar11 >> (bVar3 & 0x1f) & kBitMask[uVar4 - 0xe];
          (s->br).bit_pos_ = uVar14 + uVar17;
          uVar11 = 0;
          if (uVar4 == 0x10) {
            uVar11 = s->prev_code_len;
            sVar27 = 2;
          }
          if (s->repeat_code_len == uVar11) {
            uVar17 = s->repeat;
            if (uVar17 == 0) goto LAB_001032fd;
            iVar8 = uVar17 - 2 << sVar27;
          }
          else {
            s->repeat_code_len = uVar11;
LAB_001032fd:
            iVar8 = 0;
            uVar17 = 0;
          }
          puVar25 = s->symbol_lists;
          uVar28 = uVar23 + iVar8 + 3;
          s->repeat = uVar28;
          iVar15 = uVar28 - uVar17;
          uVar14 = iVar15 + uVar13;
          if (uVar19 < uVar14) {
            s->symbol = uVar19;
            s->space = 0xfffff;
            uVar26 = 0xfffff;
            uVar13 = uVar19;
          }
          else if (uVar11 == 0) {
            s->symbol = uVar14;
            uVar13 = uVar14;
          }
          else {
            iVar8 = ((iVar8 + uVar23) - uVar17) + 3;
            uVar23 = s->next_symbol[uVar11];
            do {
              uVar24 = uVar13;
              puVar25[(int)uVar23] = (uint16_t)uVar24;
              iVar8 = iVar8 + -1;
              uVar23 = uVar24;
              uVar13 = uVar24 + 1;
            } while (iVar8 != 0);
            s->symbol = uVar14;
            s->next_symbol[uVar11] = uVar24;
            uVar26 = uVar26 - (iVar15 << (0xfU - (char)uVar11 & 0x1f));
            s->space = uVar26;
            s->code_length_histo[uVar11] = s->code_length_histo[uVar11] + (short)iVar15;
            uVar13 = uVar14;
          }
        }
      }
    }
LAB_00103146:
    if (uVar26 != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
LAB_001033d8:
    uVar17 = BrotliBuildHuffmanTable(table,8,s->symbol_lists,s->code_length_histo);
    goto LAB_001033ee;
  }
  BVar12 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  for (uVar26 = uVar26 + 2; uVar26 - 0x41 < 2; uVar26 = uVar26 - 8) {
    sVar6 = (s->br).avail_in;
    if (sVar6 == 0) {
      BVar16 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      goto LAB_0010341a;
    }
    uVar21 = (s->br).val_;
    pbVar7 = (s->br).next_in;
    (s->br).val_ = uVar21 >> 8;
    (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
    (s->br).bit_pos_ = uVar26 - 10;
    (s->br).avail_in = sVar6 - 1;
    (s->br).next_in = pbVar7 + 1;
  }
  s->symbol = (uint)((s->br).val_ >> ((char)uVar26 - 2U & 0x3f)) & 3;
  (s->br).bit_pos_ = uVar26;
  s->sub_loop_counter = 0;
switchD_00102ab4_caseD_2:
  uVar13 = 0;
  for (uVar11 = uVar19 - 1; uVar11 != 0; uVar11 = uVar11 >> 1) {
    uVar13 = uVar13 + 1;
  }
  uVar11 = s->symbol;
  for (uVar17 = s->sub_loop_counter; uVar17 <= uVar11; uVar17 = uVar17 + 1) {
    uVar26 = (s->br).bit_pos_;
    for (iVar8 = -uVar26; uVar26 = uVar26 - 8, iVar8 + 0x40U < uVar13; iVar8 = iVar8 + 8) {
      sVar6 = (s->br).avail_in;
      if (sVar6 == 0) {
        s->sub_loop_counter = uVar17;
        BVar12 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        BVar16 = BVar12;
        goto LAB_0010341a;
      }
      uVar21 = (s->br).val_;
      pbVar7 = (s->br).next_in;
      (s->br).val_ = uVar21 >> 8;
      (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
      (s->br).bit_pos_ = uVar26;
      (s->br).avail_in = sVar6 - 1;
      (s->br).next_in = pbVar7 + 1;
    }
    uVar14 = (uint)((s->br).val_ >> (-(char)iVar8 & 0x3fU)) & kBitMask[uVar13];
    (s->br).bit_pos_ = uVar13 - iVar8;
    if (uVar19 <= uVar14) {
      return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
    }
    s->symbols_lists_array[uVar17] = (uint16_t)uVar14;
  }
  uVar21 = 0;
  while (uVar20 = uVar21, uVar20 != uVar11) {
    uVar18 = uVar20 + 1 & 0xffffffff;
    while (uVar21 = uVar20 + 1, (uint)uVar18 <= uVar11) {
      puVar25 = s->symbols_lists_array + uVar18;
      uVar18 = (ulong)((uint)uVar18 + 1);
      if (s->symbols_lists_array[uVar20] == *puVar25) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
      }
    }
  }
LAB_00102b48:
  if (uVar11 == 3) {
    BVar12 = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
    uVar21 = (ulong)(s->br).bit_pos_;
    while ((int)uVar21 == 0x40) {
      sVar6 = (s->br).avail_in;
      if (sVar6 == 0) {
        BVar16 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        goto LAB_0010341a;
      }
      uVar21 = (s->br).val_;
      pbVar7 = (s->br).next_in;
      (s->br).val_ = uVar21 >> 8;
      (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar21 >> 8;
      (s->br).bit_pos_ = 0x38;
      (s->br).avail_in = sVar6 - 1;
      (s->br).next_in = pbVar7 + 1;
      uVar21 = 0x38;
    }
    (s->br).bit_pos_ = (int)uVar21 + 1;
    uVar11 = (((s->br).val_ >> (uVar21 & 0x3f) & 1) != 0) + 3;
    s->symbol = uVar11;
  }
  uVar17 = BrotliBuildSimpleHuffmanTable(table,8,s->symbols_lists_array,uVar11);
LAB_001033ee:
  BVar12 = BROTLI_STATE_HUFFMAN_NONE;
  BVar16 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar17;
  }
LAB_0010341a:
  s->substate_huffman = BVar12;
  return BVar16;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  /* Unnecessary masking, but might be good for safety. */
  alphabet_size &= 0x3ff;
  /* State machine */
  switch (s->substate_huffman) {
    case BROTLI_STATE_HUFFMAN_NONE:
      if (!BrotliSafeReadBits(br, 2, &s->sub_loop_counter)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      BROTLI_LOG_UINT(s->sub_loop_counter);
      /* The value is used as follows:
         1 for simple code;
         0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
      if (s->sub_loop_counter != 1) {
        s->space = 32;
        s->repeat = 0; /* num_codes */
        memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo[0]) *
            (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
        memset(&s->code_length_code_lengths[0], 0,
            sizeof(s->code_length_code_lengths));
        s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
        goto Complex;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      /* Read symbols, codes & code lengths directly. */
      if (!BrotliSafeReadBits(br, 2, &s->symbol)) { /* num_symbols */
        s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->sub_loop_counter = 0;
      /* No break, transit to the next state. */
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
      BrotliDecoderErrorCode result =
          ReadSimpleHuffmanSymbols(alphabet_size, s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
      uint32_t table_size;
      if (s->symbol == 3) {
        uint32_t bits;
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->symbol += bits;
      }
      BROTLI_LOG_UINT(s->symbol);
      table_size = BrotliBuildSimpleHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbols_lists_array, s->symbol);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

Complex: /* Decode Huffman-coded code lengths. */
    case BROTLI_STATE_HUFFMAN_COMPLEX: {
      uint32_t i;
      BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      BrotliBuildCodeLengthsHuffmanTable(s->table,
                                         s->code_length_code_lengths,
                                         s->code_length_histo);
      memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo));
      for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
        s->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
        s->symbol_lists[(int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1)] = 0xFFFF;
      }

      s->symbol = 0;
      s->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
      s->repeat = 0;
      s->repeat_code_len = 0;
      s->space = 32768;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
      uint32_t table_size;
      BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size, s);
      if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
        result = SafeReadSymbolCodeLengths(alphabet_size, s);
      }
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }

      if (s->space != 0) {
        BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", s->space));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
      }
      table_size = BrotliBuildHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbol_lists, s->code_length_histo);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}